

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<kj::Maybe<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_> __thiscall
kj::AsyncCapabilityStream::tryReceiveStream(AsyncCapabilityStream *this)

{
  long lVar1;
  ResultHolder *pRVar2;
  void *pvVar3;
  long *in_RSI;
  ResultHolder *ptrCopy;
  SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2607:23)>
  *location;
  Promise<kj::AsyncCapabilityStream::ReadResult> promise;
  anon_class_16_1_6971b95b_for_func local_48;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  void *continuationTracePtr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  
  pRVar2 = (ResultHolder *)operator_new(0x18);
  (pRVar2->stream).ptr = (AsyncCapabilityStream *)0x0;
  *(undefined8 *)pRVar2 = 0;
  (pRVar2->stream).disposer = (Disposer *)0x0;
  (**(code **)(*in_RSI + 0x88))(&promise);
  local_48.result.disposer =
       (Disposer *)
       &kj::_::HeapDisposer<kj::AsyncCapabilityStream::tryReceiveStream()::ResultHolder>::instance;
  continuationTracePtr =
       kj::_::
       SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2607:23)>
       ::anon_class_16_1_6971b95b_for_func::operator();
  lVar1 = *(long *)((long)promise.super_PromiseBase.node.ptr + 8);
  local_48.result.ptr = pRVar2;
  if (lVar1 == 0 || (ulong)((long)promise.super_PromiseBase.node.ptr - lVar1) < 0x30) {
    pvVar3 = operator_new(0x400);
    location = (SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2607:23)>
                *)((long)pvVar3 + 0x3d0);
    ctor<kj::_::SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,kj::AsyncCapabilityStream::tryReceiveStream()::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::AsyncCapabilityStream::tryReceiveStream()::__0,void*&>
              (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise,&local_48,
               &continuationTracePtr);
    *(void **)((long)pvVar3 + 0x3d8) = pvVar3;
  }
  else {
    *(undefined8 *)((long)promise.super_PromiseBase.node.ptr + 8) = 0;
    location = (SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2607:23)>
                *)((long)promise.super_PromiseBase.node.ptr + -0x30);
    ctor<kj::_::SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,kj::AsyncCapabilityStream::tryReceiveStream()::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::AsyncCapabilityStream::tryReceiveStream()::__0,void*&>
              (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise,&local_48,
               &continuationTracePtr);
    *(long *)((long)promise.super_PromiseBase.node.ptr + -0x28) = lVar1;
  }
  local_38.ptr = (PromiseNode *)0x0;
  (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)location
  ;
  local_28.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_28);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_38);
  if (local_48.result.ptr != (ResultHolder *)0x0) {
    local_48.result.ptr = (ResultHolder *)0x0;
    (**(local_48.result.disposer)->_vptr_Disposer)();
  }
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<Maybe<Own<AsyncCapabilityStream>>> AsyncCapabilityStream::tryReceiveStream() {
  struct ResultHolder {
    byte b;
    Own<AsyncCapabilityStream> stream;
  };
  auto result = kj::heap<ResultHolder>();
  auto promise = tryReadWithStreams(&result->b, 1, 1, &result->stream, 1);
  return promise.then([result = kj::mv(result)](ReadResult actual) mutable
                      -> Maybe<Own<AsyncCapabilityStream>> {
    if (actual.byteCount == 0) {
      return kj::none;
    }

    KJ_REQUIRE(actual.capCount == 1,
        "expected to receive a capability (e.g. file descriptor via SCM_RIGHTS), but didn't") {
      return kj::none;
    }

    return kj::mv(result->stream);
  });
}